

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O2

int ON_UuidIndex::CompareIndex(ON_UuidIndex *a,ON_UuidIndex *b)

{
  int iVar1;
  
  if (a == (ON_UuidIndex *)0x0) {
    return -(uint)(b != (ON_UuidIndex *)0x0);
  }
  if (b == (ON_UuidIndex *)0x0) {
    iVar1 = 1;
  }
  else {
    if (b->m_i <= a->m_i) {
      return (int)(b->m_i < a->m_i);
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_UuidIndex::CompareIndex( const ON_UuidIndex* a, const ON_UuidIndex* b )
{
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;
  if (a->m_i < b->m_i)
    return -1;
  if (a->m_i > b->m_i)
    return 1;
  return 0;
}